

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_shutdown(connectdata *conn,int sockindex)

{
  int iVar1;
  int sockindex_local;
  connectdata *conn_local;
  
  iVar1 = (*Curl_ssl->shutdown)(conn,sockindex);
  if (iVar1 == 0) {
    conn->ssl[sockindex].use = false;
    conn->ssl[sockindex].state = ssl_connection_none;
    conn->recv[sockindex] = Curl_recv_plain;
    conn->send[sockindex] = Curl_send_plain;
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    conn_local._4_4_ = CURLE_SSL_SHUTDOWN_FAILED;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_shutdown(struct connectdata *conn, int sockindex)
{
  if(Curl_ssl->shutdown(conn, sockindex))
    return CURLE_SSL_SHUTDOWN_FAILED;

  conn->ssl[sockindex].use = FALSE; /* get back to ordinary socket usage */
  conn->ssl[sockindex].state = ssl_connection_none;

  conn->recv[sockindex] = Curl_recv_plain;
  conn->send[sockindex] = Curl_send_plain;

  return CURLE_OK;
}